

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall session::session(session *this,network *instance,imanager *manager)

{
  (this->super_iobject).netid_ = 0;
  (this->super_iobject).events_ = 0;
  (this->super_iobject)._vptr_iobject = (_func_int **)&PTR__session_0010dd80;
  buffer::buffer(&this->recvbuf_,0x1fa0);
  buffer::buffer(&this->sendbuf_,0);
  this->fd_ = -1;
  this->network_ = instance;
  this->manager_ = manager;
  this->closed_ = true;
  return;
}

Assistant:

session::session(network* instance, imanager* manager)
    : recvbuf_(8096), sendbuf_(0)
{
    fd_ = -1;
    network_ = instance;
    manager_ = manager;
    closed_ = true;
}